

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O0

var __thiscall cs::runtime_type::parse_choice(runtime_type *this,var *a,iterator *b)

{
  bool bVar1;
  bool *pbVar2;
  runtime_error *this_00;
  any *in_RSI;
  proxy *in_RDI;
  undefined1 in_stack_000008af;
  iterator *in_stack_000008b0;
  runtime_type *in_stack_000008b8;
  string *in_stack_ffffffffffffff68;
  any *in_stack_ffffffffffffff70;
  type_info *in_stack_ffffffffffffff78;
  allocator *paVar3;
  proxy *this_01;
  allocator local_51;
  string local_50 [8];
  iterator *in_stack_ffffffffffffffb8;
  
  this_01 = in_RDI;
  cs_impl::any::type(in_stack_ffffffffffffff70);
  bVar1 = std::type_info::operator==((type_info *)this_01,in_stack_ffffffffffffff78);
  if (!bVar1) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x28);
    paVar3 = &local_51;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_50,"Unsupported operator operations(Choice).",paVar3);
    runtime_error::runtime_error(this_00,in_stack_ffffffffffffff68);
    __cxa_throw(this_00,&runtime_error::typeinfo,runtime_error::~runtime_error);
  }
  pbVar2 = cs_impl::any::const_val<bool>(in_RSI);
  if ((*pbVar2 & 1U) == 0) {
    tree_type<cs::token_base_*>::iterator::right(in_stack_ffffffffffffffb8);
    parse_expr(in_stack_000008b8,in_stack_000008b0,(bool)in_stack_000008af);
  }
  else {
    tree_type<cs::token_base_*>::iterator::left(in_stack_ffffffffffffffb8);
    parse_expr(in_stack_000008b8,in_stack_000008b0,(bool)in_stack_000008af);
  }
  return (var)in_RDI;
}

Assistant:

var runtime_type::parse_choice(const var &a, const tree_type<token_base *>::iterator &b)
	{
		if (a.type() == typeid(boolean)) {
			if (a.const_val<boolean>())
				return parse_expr(b.left());
			else
				return parse_expr(b.right());
		}
		else
			throw runtime_error("Unsupported operator operations(Choice).");
	}